

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O2

void __thiscall
Coverage_issueRetrieval_Test::Coverage_issueRetrieval_Test(Coverage_issueRetrieval_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0012cfe0;
  return;
}

Assistant:

TEST(Coverage, issueRetrieval)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model name=\"bob\" xmlns=\"http://www.cellml.org/cellml/2.0#\"/>\n";

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(in);

    EXPECT_EQ(size_t(0), parser->issueCount());

    EXPECT_EQ(nullptr, parser->error(3));
    EXPECT_EQ(nullptr, parser->warning(4));
}